

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  bool bVar1;
  int iVar2;
  numbers_internal *pnVar3;
  int iVar4;
  uint uVar5;
  bool local_25;
  int local_24;
  string_view local_20;
  
  local_20.length_ = (size_type)text.ptr_;
  local_24 = (int)value;
  *(int *)text.length_ = 0;
  local_20.ptr_ = (char *)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_20,&local_24,&local_25);
  if (bVar1) {
    if (local_25 == false) {
      if ((long)local_24 < 0) {
        __assert_fail("base >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                      ,0x319,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType *) [IntType = int]"
                     );
      }
      pnVar3 = (numbers_internal *)(local_20.length_ + (long)local_20.ptr_);
      for (iVar4 = 0;
          (((bVar1 = pnVar3 <= local_20.ptr_, iVar2 = iVar4, !bVar1 &&
            (uVar5 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_20.ptr_],
            (int)uVar5 < local_24)) &&
           (iVar2 = 0x7fffffff,
           iVar4 <= *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase +
                            (long)local_24 * 4))) && (iVar4 * local_24 <= (int)(uVar5 ^ 0x7fffffff))
          ); iVar4 = iVar4 * local_24 + uVar5) {
        local_20.ptr_ = (char *)((numbers_internal *)local_20.ptr_ + 1);
      }
    }
    else {
      pnVar3 = (numbers_internal *)(local_20.length_ + (long)local_20.ptr_);
      for (iVar4 = 0;
          ((bVar1 = pnVar3 <= local_20.ptr_, iVar2 = iVar4, !bVar1 &&
           (uVar5 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_20.ptr_],
           (int)uVar5 < local_24)) &&
          ((iVar2 = -0x80000000,
           *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + (long)local_24 * 4) <=
           iVar4 && ((int)(uVar5 | 0x80000000) <= iVar4 * local_24))));
          iVar4 = iVar4 * local_24 - uVar5) {
        local_20.ptr_ = (char *)((numbers_internal *)local_20.ptr_ + 1);
      }
    }
    *(int *)text.length_ = iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* value, int base) {
  return safe_int_internal<int32_t>(text, value, base);
}